

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O0

int x25519_create_key_exchange(ptls_key_exchange_context_t **_ctx,ptls_iovec_t *pubkey)

{
  ptls_key_exchange_context_t *ppVar1;
  ptls_iovec_t pVar2;
  uint8_t *local_40;
  size_t local_38;
  st_x25519_key_exchange_t *ctx;
  ptls_iovec_t *pubkey_local;
  ptls_key_exchange_context_t **_ctx_local;
  
  ppVar1 = (ptls_key_exchange_context_t *)malloc(0x48);
  if (ppVar1 == (ptls_key_exchange_context_t *)0x0) {
    _ctx_local._4_4_ = 0x201;
  }
  else {
    ppVar1->on_exchange = x25519_on_exchange;
    x25519_create_keypair((uint8_t *)(ppVar1 + 1),(uint8_t *)(ppVar1 + 5));
    *_ctx = ppVar1;
    pVar2 = ptls_iovec_init(ppVar1 + 5,0x20);
    local_40 = pVar2.base;
    pubkey->base = local_40;
    local_38 = pVar2.len;
    pubkey->len = local_38;
    _ctx_local._4_4_ = 0;
  }
  return _ctx_local._4_4_;
}

Assistant:

static int x25519_create_key_exchange(ptls_key_exchange_context_t **_ctx, ptls_iovec_t *pubkey)
{
    struct st_x25519_key_exchange_t *ctx;

    if ((ctx = (struct st_x25519_key_exchange_t *)malloc(sizeof(*ctx))) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    ctx->super = (ptls_key_exchange_context_t){x25519_on_exchange};
    x25519_create_keypair(ctx->priv, ctx->pub);

    *_ctx = &ctx->super;
    *pubkey = ptls_iovec_init(ctx->pub, sizeof(ctx->pub));
    return 0;
}